

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O2

int cfg_validate_choice(autobuf *out,char *section_name,char *entry_name,char *value,
                       _func_char_ptr_size_t_void_ptr *callback,size_t choices_count,void *ptr)

{
  int iVar1;
  int iVar2;
  
  iVar1 = cfg_get_choice_index(value,callback,choices_count,ptr);
  iVar2 = 0;
  if (iVar1 < 0) {
    cfg_append_printable_line
              (out,"Unknown value \'%s\' for entry \'%s\' in section %s",value,entry_name,
               section_name);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
cfg_validate_choice(struct autobuf *out, const char *section_name, const char *entry_name, const char *value,
  const char *(*callback)(size_t idx, const void *ptr), size_t choices_count, const void *ptr) {
  int i;
  i = cfg_get_choice_index(value, callback, choices_count, ptr);
  if (i >= 0) {
    return 0;
  }

  cfg_append_printable_line(out,
    "Unknown value '%s'"
    " for entry '%s' in section %s",
    value, entry_name, section_name);
  return -1;
}